

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O3

void __thiscall
NshHistoryGetEntry_SuccessFirstElement_Test::~NshHistoryGetEntry_SuccessFirstElement_Test
          (NshHistoryGetEntry_SuccessFirstElement_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshHistoryGetEntry, SuccessFirstElement)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    nsh_history_add_entry(&hist, new_entry);

    char entry[NSH_LINE_BUFFER_SIZE] = {};
    auto status = nsh_history_get_entry(&hist, 0, entry);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_STREQ(entry, new_entry);
}